

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_long,unsigned_long>
          (Thread *this,BinopFunc<unsigned_long,_unsigned_long> *f)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  uint uVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  byte local_41;
  undefined1 auStack_40 [7];
  u8 i;
  SR result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  uint amount;
  BinopFunc<unsigned_long,_unsigned_long> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_int>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  for (local_41 = 0; local_41 < 2; local_41 = local_41 + 1) {
    puVar2 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)(result.v + 1),local_41);
    uVar3 = (*f)(*puVar2,(unsigned_long)uVar1);
    puVar2 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)auStack_40,local_41);
    *puVar2 = uVar3;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_40;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}